

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall
tetgenmesh::flip41(tetgenmesh *this,triface *fliptets,int hullflag,flipconstraints *fc)

{
  triface *ptVar1;
  tetrahedron *pppdVar2;
  tetgenmesh *p1;
  tetgenmesh *p3;
  tetrahedron ppdVar3;
  memorypool *pmVar4;
  tetgenmesh *ptVar5;
  double *pdVar6;
  long lVar7;
  undefined8 *puVar8;
  tetgenio *ptVar9;
  long lVar10;
  int *piVar11;
  ulong *puVar12;
  uint uVar13;
  int iVar14;
  flipconstraints *pfVar15;
  tetgenmesh *this_00;
  int (*paiVar16) [12];
  ulong uVar17;
  face *s;
  tetgenmesh *p0;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  tetgenmesh *ptVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  triface local_130;
  tetgenmesh *local_120;
  tetgenmesh *local_118;
  tetgenmesh *local_110;
  tetgenmesh *local_108;
  flipconstraints *local_100;
  triface *local_f8;
  face checkseg;
  triface local_c8;
  triface topcastets [3];
  face flipshs [4];
  
  lVar10 = 8;
  do {
    *(undefined8 *)((long)topcastets + lVar10 + -8) = 0;
    *(undefined4 *)((long)&topcastets[0].tet + lVar10) = 0;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  local_130.tet = (tetrahedron *)0x0;
  local_130.ver = 0;
  lVar10 = 0;
  do {
    *(undefined8 *)((long)&flipshs[0].sh + lVar10) = 0;
    *(undefined4 *)((long)&flipshs[0].shver + lVar10) = 0;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x40);
  ptVar1 = fliptets + 3;
  pppdVar2 = fliptets[3].tet;
  uVar13 = fliptets[3].ver;
  local_108 = (tetgenmesh *)pppdVar2[orgpivot[(int)uVar13]];
  p1 = (tetgenmesh *)pppdVar2[destpivot[(int)uVar13]];
  local_120 = (tetgenmesh *)pppdVar2[apexpivot[(int)uVar13]];
  p3 = (tetgenmesh *)fliptets->tet[destpivot[fliptets->ver]];
  local_118 = (tetgenmesh *)fliptets->tet[orgpivot[fliptets->ver]];
  this->flip41count = this->flip41count + 1;
  paiVar16 = facepivot2;
  for (lVar10 = 8; lVar10 != 0x38; lVar10 = lVar10 + 0x10) {
    iVar14 = enexttbl[*(int *)((long)&fliptets->tet + lVar10)];
    uVar19 = *(ulong *)(*(long *)((long)fliptets + lVar10 + -8) + (long)facepivot1[iVar14] * 8);
    *(ulong *)((long)topcastets + lVar10 + -8) = uVar19 & 0xfffffffffffffff0;
    *(int *)((long)&topcastets[0].tet + lVar10) = enexttbl[facepivot2[iVar14][(uint)uVar19 & 0xf]];
  }
  local_c8.tet = (tetrahedron *)((ulong)pppdVar2[uVar13 & 3] & 0xfffffffffffffff0);
  local_c8.ver = fsymtbl[(int)uVar13][(uint)pppdVar2[uVar13 & 3] & 0xf];
  local_110 = this;
  local_100 = fc;
  if (this->checksubfaceflag == 0) {
    iVar14 = -1;
  }
  else {
    uVar19 = 0xffffffffffffffff;
    s = flipshs;
    uVar13 = 0;
    local_f8 = fliptets;
    for (uVar17 = 0; fliptets = local_f8, iVar18 = (int)uVar19, uVar17 != 3; uVar17 = uVar17 + 1) {
      fnext(this,ptVar1,&local_130);
      paiVar16 = (int (*) [12])this;
      tspivot(this,&local_130,s);
      bVar20 = s->sh != (shellface *)0x0;
      if (bVar20) {
        uVar19 = uVar17;
      }
      uVar19 = uVar19 & 0xffffffff;
      uVar13 = uVar13 + bVar20;
      local_f8[3].ver = enexttbl[local_f8[3].ver];
      s = s + 1;
    }
    iVar14 = iVar18;
    if ((uVar13 != 0) && (iVar14 = 3, uVar13 < 3)) {
      ppdVar3 = topcastets[iVar18].tet[topcastets[iVar18].ver & 3];
      piVar11 = fsymtbl[topcastets[iVar18].ver] + ((uint)ppdVar3 & 0xf);
      for (lVar10 = 0; iVar14 = iVar18, lVar10 != 0x30; lVar10 = lVar10 + 0x10) {
        iVar14 = *piVar11;
        local_130.ver = esymtbl[iVar14];
        paiVar16 = (int (*) [12])local_110;
        local_130.tet = (tetrahedron *)((ulong)ppdVar3 & 0xfffffffffffffff0);
        tspivot(local_110,&local_130,(face *)((long)&flipshs[0].sh + lVar10));
        piVar11 = eprevtbl + iVar14;
      }
    }
  }
  p0 = local_108;
  this_00 = local_110;
  fliptets->ver = 0xb;
  pppdVar2 = fliptets->tet;
  *(undefined4 *)((long)pppdVar2 + (long)local_110->elemmarkerindex * 4) = 0;
  if ((local_110->checksubsegflag != 0) && (ppdVar3 = pppdVar2[8], ppdVar3 != (tetrahedron)0x0)) {
    pmVar4 = local_110->tet2segpool;
    *ppdVar3 = (double *)pmVar4->deaditemstack;
    pmVar4->deaditemstack = ppdVar3;
    pmVar4->items = pmVar4->items + -1;
    fliptets->tet[8] = (tetrahedron)0x0;
  }
  if ((local_110->checksubfaceflag != 0) &&
     (ppdVar3 = fliptets->tet[9], ppdVar3 != (tetrahedron)0x0)) {
    pmVar4 = local_110->tet2subpool;
    *ppdVar3 = (double *)pmVar4->deaditemstack;
    pmVar4->deaditemstack = ppdVar3;
    pmVar4->items = pmVar4->items + -1;
    fliptets->tet[9] = (tetrahedron)0x0;
  }
  for (lVar10 = 0x10; pfVar15 = local_100, ptVar21 = local_118, lVar10 != 0x40;
      lVar10 = lVar10 + 0x10) {
    paiVar16 = (int (*) [12])this_00;
    tetrahedrondealloc(this_00,*(tetrahedron **)((long)&fliptets->tet + lVar10));
  }
  ptVar5 = (tetgenmesh *)this_00->dummypoint;
  if (local_118 != ptVar5) {
    *(uint *)((long)&local_118->in + (long)this_00->pointmarkindex * 4 + 4) =
         (uint)*(byte *)((long)&local_118->in + (long)this_00->pointmarkindex * 4 + 4);
    this_00->unuverts = this_00->unuverts + 1;
  }
  if (hullflag < 1) {
    iVar18 = fliptets->ver;
    fliptets->tet[orgpivot[iVar18]] = (tetrahedron)p0;
    fliptets->tet[destpivot[iVar18]] = (tetrahedron)p1;
    fliptets->tet[apexpivot[iVar18]] = (tetrahedron)local_120;
    fliptets->tet[oppopivot[iVar18]] = (tetrahedron)p3;
    iVar18 = 0;
  }
  else {
    if (p0 == ptVar5) {
      iVar18 = fliptets->ver;
      fliptets->tet[orgpivot[iVar18]] = (tetrahedron)local_120;
      fliptets->tet[destpivot[iVar18]] = (tetrahedron)p1;
      fliptets->tet[apexpivot[iVar18]] = (tetrahedron)p3;
      fliptets->tet[oppopivot[iVar18]] = (tetrahedron)p0;
      iVar18 = esymtbl[iVar18];
      fliptets->ver = iVar18;
      piVar11 = eprevtbl + iVar18;
      iVar18 = 1;
LAB_0011c64e:
      fliptets->ver = *piVar11;
    }
    else {
      if (p1 == ptVar5) {
        iVar18 = fliptets->ver;
        fliptets->tet[orgpivot[iVar18]] = (tetrahedron)p0;
        fliptets->tet[destpivot[iVar18]] = (tetrahedron)local_120;
        fliptets->tet[apexpivot[iVar18]] = (tetrahedron)p3;
        fliptets->tet[oppopivot[iVar18]] = (tetrahedron)p1;
        iVar18 = esymtbl[iVar18];
        fliptets->ver = iVar18;
        piVar11 = enexttbl + iVar18;
        iVar18 = 2;
        goto LAB_0011c64e;
      }
      paiVar16 = (int (*) [12])local_120;
      if (local_120 == ptVar5) {
        iVar18 = fliptets->ver;
        fliptets->tet[orgpivot[iVar18]] = (tetrahedron)p1;
        fliptets->tet[destpivot[iVar18]] = (tetrahedron)p0;
        fliptets->tet[apexpivot[iVar18]] = (tetrahedron)p3;
        fliptets->tet[oppopivot[iVar18]] = (tetrahedron)local_120;
        piVar11 = esymtbl + iVar18;
        iVar18 = 3;
        goto LAB_0011c64e;
      }
      iVar18 = fliptets->ver;
      fliptets->tet[orgpivot[iVar18]] = (tetrahedron)p0;
      fliptets->tet[destpivot[iVar18]] = (tetrahedron)p1;
      fliptets->tet[apexpivot[iVar18]] = (tetrahedron)local_120;
      fliptets->tet[oppopivot[iVar18]] = (tetrahedron)p3;
      if (p3 != ptVar5) {
        iVar18 = 0;
        if (local_118 == (tetgenmesh *)this_00->dummypoint) {
          this_00->hullsize = this_00->hullsize + -4;
          iVar18 = -1;
        }
        goto LAB_0011c65d;
      }
      iVar18 = 4;
    }
    this_00->hullsize = this_00->hullsize + -2;
  }
LAB_0011c65d:
  local_f8 = (triface *)CONCAT44(local_f8._4_4_,iVar14);
  if (local_100->remove_ndelaunay_edge == 0) goto LAB_0011c7ca;
  if (iVar18 < 1) {
    if (iVar18 < 0) {
      dVar22 = tetprismvol((tetgenmesh *)paiVar16,(double *)p0,(double *)p1,(double *)local_120,
                           (double *)p3);
      ptVar21 = (tetgenmesh *)0x0;
      dVar24 = 0.0;
      dVar25 = 0.0;
      dVar23 = 0.0;
    }
    else {
      dVar23 = tetprismvol((tetgenmesh *)paiVar16,(double *)local_118,(double *)p3,(double *)p0,
                           (double *)p1);
      ptVar5 = local_120;
      dVar25 = tetprismvol((tetgenmesh *)paiVar16,(double *)ptVar21,(double *)p3,(double *)p1,
                           (double *)local_120);
      dVar24 = tetprismvol((tetgenmesh *)paiVar16,(double *)ptVar21,(double *)p3,(double *)ptVar5,
                           (double *)p0);
      pfVar15 = local_100;
      local_118 = (tetgenmesh *)
                  tetprismvol((tetgenmesh *)paiVar16,(double *)p0,(double *)p1,(double *)ptVar5,
                              (double *)ptVar21);
      dVar22 = tetprismvol((tetgenmesh *)paiVar16,(double *)p0,(double *)p1,(double *)ptVar5,
                           (double *)p3);
      ptVar21 = local_118;
    }
  }
  else {
    ptVar21 = (tetgenmesh *)this_00->dummypoint;
    if (p0 == ptVar21) {
      dVar25 = tetprismvol((tetgenmesh *)paiVar16,(double *)local_118,(double *)p3,(double *)p1,
                           (double *)local_120);
      ptVar21 = (tetgenmesh *)0x0;
      dVar24 = 0.0;
LAB_0011c7a8:
      dVar23 = 0.0;
    }
    else {
      if (p1 == ptVar21) {
        dVar24 = tetprismvol((tetgenmesh *)paiVar16,(double *)local_118,(double *)p3,
                             (double *)local_120,(double *)p0);
        ptVar21 = (tetgenmesh *)0x0;
LAB_0011c7a4:
        dVar25 = 0.0;
        goto LAB_0011c7a8;
      }
      if (local_120 != ptVar21) {
        ptVar21 = (tetgenmesh *)
                  tetprismvol((tetgenmesh *)paiVar16,(double *)p0,(double *)p1,(double *)local_120,
                              (double *)local_118);
        dVar24 = 0.0;
        goto LAB_0011c7a4;
      }
      dVar23 = tetprismvol((tetgenmesh *)paiVar16,(double *)local_118,(double *)p3,(double *)p0,
                           (double *)p1);
      ptVar21 = (tetgenmesh *)0x0;
      dVar24 = 0.0;
      dVar25 = 0.0;
    }
    dVar22 = 0.0;
  }
  pfVar15->tetprism_vol_sum =
       ((((dVar22 - dVar23) - dVar25) - dVar24) - (double)ptVar21) + pfVar15->tetprism_vol_sum;
LAB_0011c7ca:
  for (lVar10 = 0; lVar10 != 0x30; lVar10 = lVar10 + 0x10) {
    local_130.tet = fliptets->tet;
    local_130.ver = esymtbl[fliptets->ver];
    bond(this_00,&local_130,(triface *)((long)&topcastets[0].tet + lVar10));
    fliptets->ver = enexttbl[fliptets->ver];
  }
  bond(this_00,fliptets,&local_c8);
  pfVar15 = local_100;
  if (this_00->checksubsegflag != 0) {
    checkseg.sh = (shellface *)0x0;
    checkseg.shver = 0;
    for (lVar10 = 8; this_00 = local_110, lVar10 != 0x38; lVar10 = lVar10 + 0x10) {
      local_130.tet = *(tetrahedron **)((long)topcastets + lVar10 + -8);
      local_130.ver = eprevtbl[*(int *)((long)&topcastets[0].tet + lVar10)];
      if ((local_130.tet[8] != (tetrahedron)0x0) &&
         (pdVar6 = local_130.tet[8][ver2edge[local_130.ver]], pdVar6 != (double *)0x0)) {
        checkseg.shver = (uint)pdVar6 & 7;
        checkseg.sh = (shellface *)((ulong)pdVar6 & 0xfffffffffffffff8);
        local_130.tet = fliptets->tet;
        local_130.ver = enexttbl[esymtbl[fliptets->ver]];
        tssbond1(local_110,&local_130,&checkseg);
        checkseg.sh[9] = (shellface)((long)local_130.ver | (ulong)local_130.tet);
        if ((pfVar15->chkencflag & 1) != 0) {
          enqueuesubface(local_110,local_110->badsubsegs,&checkseg);
        }
      }
      fliptets->ver = enexttbl[fliptets->ver];
    }
    for (lVar10 = 0; p0 = local_108, lVar10 != 0x30; lVar10 = lVar10 + 0x10) {
      lVar7 = *(long *)(*(long *)((long)&topcastets[0].tet + lVar10) + 0x40);
      if ((lVar7 != 0) &&
         (*(long *)(lVar7 + (long)ver2edge[*(int *)((long)&topcastets[0].ver + lVar10)] * 8) != 0))
      {
        tsspivot1(this_00,(triface *)((long)&topcastets[0].tet + lVar10),&checkseg);
        tssbond1(this_00,fliptets,&checkseg);
        checkseg.sh[9] = (shellface)((long)fliptets->ver | (ulong)fliptets->tet);
        if ((pfVar15->chkencflag & 1) != 0) {
          enqueuesubface(this_00,this_00->badsubsegs,&checkseg);
        }
      }
      fliptets->ver = enexttbl[fliptets->ver];
    }
  }
  if (this_00->checksubfaceflag != 0) {
    checkseg.sh = (shellface *)0x0;
    checkseg.shver = 0;
    for (lVar10 = 0; lVar10 != 0x30; lVar10 = lVar10 + 0x10) {
      lVar7 = *(long *)(*(long *)((long)&topcastets[0].tet + lVar10) + 0x48);
      if ((lVar7 != 0) &&
         (*(long *)(lVar7 + (ulong)(*(uint *)((long)&topcastets[0].ver + lVar10) & 3) * 8) != 0)) {
        tspivot(this_00,(triface *)((long)&topcastets[0].tet + lVar10),&checkseg);
        local_130.tet = fliptets->tet;
        local_130.ver = esymtbl[fliptets->ver];
        checkseg.shver = checkseg.shver ^ 1;
        tsbond(this_00,&local_130,&checkseg);
        if ((pfVar15->chkencflag & 2) != 0) {
          enqueuesubface(this_00,this_00->badsubfacs,&checkseg);
        }
      }
      fliptets->ver = enexttbl[fliptets->ver];
    }
    if ((local_c8.tet[9] != (tetrahedron)0x0) &&
       (local_c8.tet[9][local_c8.ver & 3] != (double *)0x0)) {
      tspivot(this_00,&local_c8,&checkseg);
      checkseg.shver = checkseg.shver ^ 1;
      tsbond(this_00,fliptets,&checkseg);
      if ((pfVar15->chkencflag & 2) != 0) {
        enqueuesubface(this_00,this_00->badsubfacs,&checkseg);
      }
    }
    ptVar1 = local_f8;
    p0 = local_108;
    iVar14 = (int)local_f8;
    if (-1 < (int)local_f8) {
      for (lVar10 = 8; lVar10 != 0x38; lVar10 = lVar10 + 0x10) {
        *(int *)((long)&flipshs[0].sh + lVar10) =
             snextpivot[snextpivot[*(int *)((long)&flipshs[0].sh + lVar10)]];
      }
      flip31(this_00,flipshs,0);
      for (lVar10 = 0; lVar10 != 0x30; lVar10 = lVar10 + 0x10) {
        pmVar4 = this_00->subfaces;
        puVar8 = *(undefined8 **)((long)&flipshs[0].sh + lVar10);
        puVar8[3] = 0;
        *puVar8 = pmVar4->deaditemstack;
        pmVar4->deaditemstack = puVar8;
        pmVar4->items = pmVar4->items + -1;
      }
      if (iVar14 < 3) {
        tsbond(this_00,topcastets + ((ulong)ptVar1 & 0xffffffff),flipshs + 3);
        uVar13 = topcastets[(ulong)ptVar1 & 0xffffffff].ver;
        puVar12 = (ulong *)((ulong)((uVar13 & 3) << 3) +
                           (long)topcastets[(ulong)ptVar1 & 0xffffffff].tet);
      }
      else {
        tsbond(this_00,fliptets,flipshs + 3);
        uVar13 = fliptets->ver;
        puVar12 = (ulong *)((ulong)((uVar13 & 3) << 3) + (long)fliptets->tet);
      }
      pfVar15 = local_100;
      local_130.tet = (tetrahedron *)(*puVar12 & 0xfffffffffffffff0);
      local_130.ver = fsymtbl[(int)uVar13][(uint)*puVar12 & 0xf];
      checkseg.sh = flipshs[3].sh;
      checkseg.shver = flipshs[3].shver ^ 1;
      tsbond(this_00,&local_130,&checkseg);
    }
  }
  if ((pfVar15->chkencflag & 4) != 0) {
    enqueuetetrahedron(this_00,fliptets);
  }
  ptVar9 = (tetgenio *)fliptets->tet;
  iVar14 = this_00->point2simindex;
  (&p0->in)[iVar14] = ptVar9;
  (&p1->in)[iVar14] = ptVar9;
  ptVar9 = (tetgenio *)fliptets->tet;
  (&local_120->in)[iVar14] = ptVar9;
  (&p3->in)[iVar14] = ptVar9;
  if (0 < pfVar15->enqflag) {
    flippush(this_00,&this_00->flipstack,fliptets);
    if (1 < pfVar15->enqflag) {
      iVar14 = 3;
      while (bVar20 = iVar14 != 0, iVar14 = iVar14 + -1, bVar20) {
        local_130.tet = fliptets->tet;
        local_130.ver = esymtbl[fliptets->ver];
        flippush(this_00,&this_00->flipstack,&local_130);
        fliptets->ver = enexttbl[fliptets->ver];
      }
    }
  }
  (this_00->recenttet).tet = fliptets->tet;
  (this_00->recenttet).ver = fliptets->ver;
  return;
}

Assistant:

void tetgenmesh::flip41(triface* fliptets, int hullflag, flipconstraints *fc)
{
  triface topcastets[3], botcastet;
  triface newface, neightet;
  face flipshs[4];
  point pa, pb, pc, pd, pp;
  int dummyflag = 0; // in {0, 1, 2, 3, 4}
  int spivot = -1, scount = 0;
  int t1ver; 
  int i;

  pa =  org(fliptets[3]);
  pb = dest(fliptets[3]);
  pc = apex(fliptets[3]);
  pd = dest(fliptets[0]);
  pp =  org(fliptets[0]); // The removing vertex.

  flip41count++;

  // Get the outer boundary faces.
  for (i = 0; i < 3; i++) {
    enext(fliptets[i], topcastets[i]);
    fnextself(topcastets[i]); // [d,a,b,#], [d,b,c,#], [d,c,a,#]
    enextself(topcastets[i]); // [a,b,d,#], [b,c,d,#], [c,a,d,#]
  }
  fsym(fliptets[3], botcastet); // [b,a,c,#]

  if (checksubfaceflag) {
    // Check if there are three subfaces at 'p'.
    //   Re-use 'newface'.
    for (i = 0; i < 3; i++) {
      fnext(fliptets[3], newface); // [a,b,p,d],[b,c,p,d],[c,a,p,d].
      tspivot(newface, flipshs[i]);
      if (flipshs[i].sh != NULL) {
        spivot = i; // Remember this subface.
        scount++;
      }
      enextself(fliptets[3]);
    }
    if (scount > 0) {
      // There are three subfaces connecting at p.
      if (scount < 3) {
        // The new subface is one of {[a,b,d], [b,c,d], [c,a,d]}.
        // Go to the tet containing the three subfaces.
        fsym(topcastets[spivot], neightet);
        // Get the three subfaces connecting at p.
        for (i = 0; i < 3; i++) {
          esym(neightet, newface);
          tspivot(newface, flipshs[i]);
          eprevself(neightet);
        }
      } else {
        spivot = 3; // The new subface is [a,b,c].
      }
    }
  } // if (checksubfaceflag)


  // Re-use fliptets[0] for [a,b,c,d].
  fliptets[0].ver = 11;
  setelemmarker(fliptets[0].tet, 0); // Clean all flags.
  // NOTE: the element attributes and volume constraint remain unchanged.
  if (checksubsegflag) {
    // Dealloc the space to subsegments.
    if (fliptets[0].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[0].tet[8]);
      fliptets[0].tet[8] = NULL;
    }
  }
  if (checksubfaceflag) {
    // Dealloc the space to subfaces.
    if (fliptets[0].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[0].tet[9]);
      fliptets[0].tet[9] = NULL;
    }
  }
  // Delete the other three tets.
  for (i = 1; i < 4; i++) {
    tetrahedrondealloc(fliptets[i].tet);
  }

  if (pp != dummypoint) {
    // Mark the point pp as unused.
    setpointtype(pp, UNUSEDVERTEX);
    unuverts++;
  }

  // Create the new tet [a,b,c,d].
  if (hullflag > 0) {
    // One of the five vertices may be 'dummypoint'.
    if (pa == dummypoint) {
      // pa is dummypoint.
      setvertices(fliptets[0], pc, pb, pd, pa);
      esymself(fliptets[0]);  // [b,c,a,d]
      eprevself(fliptets[0]); // [a,b,c,d]
      dummyflag = 1;
    } else if (pb == dummypoint) {
      setvertices(fliptets[0], pa, pc, pd, pb);
      esymself(fliptets[0]);  // [c,a,b,d]
      enextself(fliptets[0]); // [a,b,c,d]
      dummyflag = 2;
    } else if (pc == dummypoint) {
      setvertices(fliptets[0], pb, pa, pd, pc);
      esymself(fliptets[0]);  // [a,b,c,d]
      dummyflag = 3;
    } else if (pd == dummypoint) {
      setvertices(fliptets[0], pa, pb, pc, pd);
      dummyflag = 4;
    } else {
      setvertices(fliptets[0], pa, pb, pc, pd);
      if (pp == dummypoint) {
        dummyflag = -1;
      } else {
        dummyflag = 0;
      }
    }
    if (dummyflag > 0) {
      // We deleted 3 hull tets, and create 1 hull tet.
      hullsize -= 2;
    } else if (dummyflag < 0) {
      // We deleted 4 hull tets.
      hullsize -= 4;
      // meshedges does not change.
    }
  } else {
    setvertices(fliptets[0], pa, pb, pc, pd);
  }

  if (fc->remove_ndelaunay_edge) { // calc_tetprism_vol
    REAL volneg[4], volpos[1], vol_diff;
    if (dummyflag > 0) {
      if (pa == dummypoint) {
        volneg[0] = 0.;
        volneg[1] = tetprismvol(pp, pd, pb, pc);
        volneg[2] = 0.;
        volneg[3] = 0.;
      } else if (pb == dummypoint) {
        volneg[0] = 0.;
        volneg[1] = 0.;
        volneg[2] = tetprismvol(pp, pd, pc, pa);
        volneg[3] = 0.;
      } else if (pc == dummypoint) {
        volneg[0] = tetprismvol(pp, pd, pa, pb);
        volneg[1] = 0.;
        volneg[2] = 0.;
        volneg[3] = 0.;
      } else { // pd == dummypoint
        volneg[0] = 0.;
        volneg[1] = 0.;
        volneg[2] = 0.;
        volneg[3] = tetprismvol(pa, pb, pc, pp);
      }
      volpos[0] = 0.;
    } else if (dummyflag < 0) {
      volneg[0] = 0.;
      volneg[1] = 0.;
      volneg[2] = 0.;
      volneg[3] = 0.;
      volpos[0] = tetprismvol(pa, pb, pc, pd);
    } else {
      volneg[0] = tetprismvol(pp, pd, pa, pb);
      volneg[1] = tetprismvol(pp, pd, pb, pc);
      volneg[2] = tetprismvol(pp, pd, pc, pa);
      volneg[3] = tetprismvol(pa, pb, pc, pp);
      volpos[0] = tetprismvol(pa, pb, pc, pd);
    }
    vol_diff = volpos[0] - volneg[0] - volneg[1] - volneg[2] - volneg[3];
    fc->tetprism_vol_sum  += vol_diff; // Update the total sum.
  }

  // Bond the new tet to adjacent tets.
  for (i = 0; i < 3; i++) {
    esym(fliptets[0], newface); // At faces [b,a,d], [c,b,d], [a,c,d].
    bond(newface, topcastets[i]);
    enextself(fliptets[0]);
  }
  bond(fliptets[0], botcastet);

  if (checksubsegflag) {
    face checkseg;
    // Bond 6 segments (at edges of [a,b,c,d]) if there there are.
    for (i = 0; i < 3; i++) {
      eprev(topcastets[i], newface); // At edges [d,a],[d,b],[d,c].
      if (issubseg(newface)) {
        tsspivot1(newface, checkseg);
        esym(fliptets[0], newface);
        enextself(newface); // At edges [a,d], [b,d], [c,d].
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
    }
    for (i = 0; i < 3; i++) {
      if (issubseg(topcastets[i])) {
        tsspivot1(topcastets[i], checkseg); // At edges [a,b],[b,c],[c,a].
        tssbond1(fliptets[0], checkseg);
        sstbond1(checkseg, fliptets[0]);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
    }
  }

  if (checksubfaceflag) {
    face checksh;
    // Bond 4 subfaces (at faces of [a,b,c,d]) if there are.
    for (i = 0; i < 3; i++) {
      if (issubface(topcastets[i])) {
        tspivot(topcastets[i], checksh); // At faces [a,b,d],[b,c,d],[c,a,d]
        esym(fliptets[0], newface); // At faces [b,a,d],[c,b,d],[a,c,d]
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
      enextself(fliptets[0]);
    }
    if (issubface(botcastet)) {
      tspivot(botcastet, checksh); // At face [b,a,c]
      sesymself(checksh);
      tsbond(fliptets[0], checksh);
      if (fc->chkencflag & 2) {
        enqueuesubface(badsubfacs, &checksh);
      }
    }

    if (spivot >= 0) {
      // Perform a 3-to-1 flip in surface triangulation.
      // Depending on the value of 'spivot', the three subfaces are:
      //   - 0: [a,b,p], [b,d,p], [d,a,p]
      //   - 1: [b,c,p], [c,d,p], [d,b,p] 
      //   - 2: [c,a,p], [a,d,p], [d,c,p] 
      //   - 3: [a,b,p], [b,c,p], [c,a,p]
      // Adjust the three subfaces such that their origins are p, i.e., 
      //   - 3: [p,a,b], [p,b,c], [p,c,a]. (Required by the flip31()).
      for (i = 0; i < 3; i++) {
        senext2self(flipshs[i]);
      }
      flip31(flipshs, 0);
      // Delete the three old subfaces.
      for (i = 0; i < 3; i++) {
        shellfacedealloc(subfaces, flipshs[i].sh);
      }
      if (spivot < 3) {
        // // Bond the new subface to the new tet [a,b,c,d].
        tsbond(topcastets[spivot], flipshs[3]);
        fsym(topcastets[spivot], newface);
        sesym(flipshs[3], checksh);
        tsbond(newface, checksh);
      } else {
        // Bound the new subface [a,b,c] to the new tet [a,b,c,d].
        tsbond(fliptets[0], flipshs[3]);
        fsym(fliptets[0], newface);
        sesym(flipshs[3], checksh);
        tsbond(newface, checksh);
      }
    } // if (spivot > 0)
  } // if (checksubfaceflag)

  if (fc->chkencflag & 4) {
    enqueuetetrahedron(&(fliptets[0]));
  }

  // Update the point-to-tet map.
  setpoint2tet(pa, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pb, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pc, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pd, (tetrahedron) fliptets[0].tet);

  if (fc->enqflag > 0) {
    // Queue faces which may be locally non-Delaunay.
    flippush(flipstack, &(fliptets[0])); // [a,b,c] (opposite to new point).
    if (fc->enqflag > 1) {
      for (i = 0; i < 3; i++) {
        esym(fliptets[0], newface);
        flippush(flipstack, &newface);
        enextself(fliptets[0]);
      }
    }
  }

  recenttet = fliptets[0];
}